

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_type_extension.cpp
# Opt level: O2

void __thiscall
duckdb::ArrowTypeExtension::ArrowTypeExtension
          (ArrowTypeExtension *this,string *vendor_name,string *type_name,string *arrow_format,
          shared_ptr<duckdb::ArrowTypeExtensionData,_true> *type)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  allocator local_b1;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  this->populate_arrow_schema = (populate_arrow_schema_t)0x0;
  this->get_type = (get_type_t)0x0;
  ::std::__cxx11::string::string((string *)&local_90,"arrow.opaque",&local_b1);
  ::std::__cxx11::string::string((string *)&local_b0,(string *)vendor_name);
  ::std::__cxx11::string::string((string *)&local_50,(string *)type_name);
  ::std::__cxx11::string::string((string *)&local_70,(string *)arrow_format);
  ArrowExtensionMetadata::ArrowExtensionMetadata
            (&this->extension_metadata,&local_90,&local_b0,&local_50,&local_70);
  ::std::__cxx11::string::~string((string *)&local_70);
  ::std::__cxx11::string::~string((string *)&local_50);
  ::std::__cxx11::string::~string((string *)&local_b0);
  ::std::__cxx11::string::~string((string *)&local_90);
  (this->type_extension).internal.
  super___shared_ptr<duckdb::ArrowTypeExtensionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar1 = (type->internal).
           super___shared_ptr<duckdb::ArrowTypeExtensionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var2 = (type->internal).
           super___shared_ptr<duckdb::ArrowTypeExtensionData,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (type->internal).super___shared_ptr<duckdb::ArrowTypeExtensionData,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->type_extension).internal.
  super___shared_ptr<duckdb::ArrowTypeExtensionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
  (this->type_extension).internal.
  super___shared_ptr<duckdb::ArrowTypeExtensionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var2;
  (type->internal).super___shared_ptr<duckdb::ArrowTypeExtensionData,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  return;
}

Assistant:

ArrowTypeExtension::ArrowTypeExtension(string vendor_name, string type_name, string arrow_format,
                                       shared_ptr<ArrowTypeExtensionData> type)
    : extension_metadata(ArrowExtensionMetadata::ARROW_EXTENSION_NON_CANONICAL, std::move(vendor_name),
                         std::move(type_name), std::move(arrow_format)),
      type_extension(std::move(type)) {
}